

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O2

int __thiscall cmGraphVizWriter::CollectAllExternalLibs(cmGraphVizWriter *this,int cnt)

{
  cmTarget *pcVar1;
  char *pcVar2;
  bool bVar3;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *pvVar4;
  string *psVar5;
  iterator iVar6;
  ostream *this_00;
  mapped_type *this_01;
  mapped_type *ppcVar7;
  pointer ppcVar8;
  pointer ppVar9;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targets;
  ostringstream ostr;
  int local_240;
  allocator local_239;
  cmGraphVizWriter *local_238;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>_>
  *local_230;
  pointer local_228;
  pointer local_220;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_218;
  string *local_210;
  _Base_ptr local_208;
  _Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> local_200;
  key_type local_1e8;
  key_type local_1c8;
  string local_1a8 [11];
  
  pvVar4 = this->LocalGenerators;
  local_230 = &this->TargetPtrs;
  local_208 = &(this->TargetPtrs)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_210 = (string *)&this->GraphNodePrefix;
  local_218 = &this->TargetNamesNodes;
  local_240 = cnt;
  local_238 = this;
  for (local_228 = (pvVar4->
                   super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
                   _M_impl.super__Vector_impl_data._M_start;
      local_228 !=
      (pvVar4->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
      super__Vector_impl_data._M_finish; local_228 = local_228 + 1) {
    std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
              ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&local_200,
               &(*local_228)->GeneratorTargets);
    for (ppcVar8 = local_200._M_impl.super__Vector_impl_data._M_start;
        ppcVar8 != local_200._M_impl.super__Vector_impl_data._M_finish; ppcVar8 = ppcVar8 + 1) {
      psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(*ppcVar8);
      std::__cxx11::string::string
                ((string *)local_1a8,(psVar5->_M_dataplus)._M_p,(allocator *)&local_1e8);
      bVar3 = IgnoreThisTarget(local_238,local_1a8);
      std::__cxx11::string::~string((string *)local_1a8);
      if (!bVar3) {
        pcVar1 = (*ppcVar8)->Target;
        local_220 = ppcVar8;
        for (ppVar9 = (pcVar1->OriginalLinkLibraries).
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppcVar8 = local_220,
            ppVar9 != (pcVar1->OriginalLinkLibraries).
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish; ppVar9 = ppVar9 + 1) {
          pcVar2 = (ppVar9->first)._M_dataplus._M_p;
          std::__cxx11::string::string((string *)local_1a8,pcVar2,(allocator *)&local_1e8);
          bVar3 = IgnoreThisTarget(local_238,local_1a8);
          std::__cxx11::string::~string((string *)local_1a8);
          if (!bVar3) {
            std::__cxx11::string::string((string *)local_1a8,pcVar2,(allocator *)&local_1e8);
            iVar6 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>_>
                    ::find(&local_230->_M_t,local_1a8);
            std::__cxx11::string::~string((string *)local_1a8);
            if (iVar6._M_node == local_208) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              this_00 = std::operator<<((ostream *)local_1a8,local_210);
              std::ostream::operator<<(this_00,local_240);
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::string((string *)&local_1c8,pcVar2,&local_239);
              this_01 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator[](local_218,&local_1c8);
              std::__cxx11::string::operator=((string *)this_01,(string *)&local_1e8);
              std::__cxx11::string::~string((string *)&local_1c8);
              std::__cxx11::string::~string((string *)&local_1e8);
              std::__cxx11::string::string((string *)&local_1e8,pcVar2,(allocator *)&local_1c8);
              ppcVar7 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>_>
                        ::operator[](local_230,&local_1e8);
              local_240 = local_240 + 1;
              *ppcVar7 = (mapped_type)0x0;
              std::__cxx11::string::~string((string *)&local_1e8);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            }
          }
        }
      }
    }
    std::_Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::~_Vector_base
              (&local_200);
    pvVar4 = local_238->LocalGenerators;
  }
  return local_240;
}

Assistant:

int cmGraphVizWriter::CollectAllExternalLibs(int cnt)
{
  // Ok, now find all the stuff we link to that is not in cmake
  for (std::vector<cmLocalGenerator*>::const_iterator lit =
         this->LocalGenerators.begin();
       lit != this->LocalGenerators.end(); ++lit) {
    std::vector<cmGeneratorTarget*> targets = (*lit)->GetGeneratorTargets();
    for (std::vector<cmGeneratorTarget*>::const_iterator it = targets.begin();
         it != targets.end(); ++it) {
      const char* realTargetName = (*it)->GetName().c_str();
      if (this->IgnoreThisTarget(realTargetName)) {
        // Skip ignored targets
        continue;
      }
      const cmTarget::LinkLibraryVectorType* ll =
        &((*it)->Target->GetOriginalLinkLibraries());
      for (cmTarget::LinkLibraryVectorType::const_iterator llit = ll->begin();
           llit != ll->end(); ++llit) {
        const char* libName = llit->first.c_str();
        if (this->IgnoreThisTarget(libName)) {
          // Skip ignored targets
          continue;
        }

        std::map<std::string, const cmGeneratorTarget*>::const_iterator tarIt =
          this->TargetPtrs.find(libName);
        if (tarIt == this->TargetPtrs.end()) {
          std::ostringstream ostr;
          ostr << this->GraphNodePrefix << cnt++;
          this->TargetNamesNodes[libName] = ostr.str();
          this->TargetPtrs[libName] = CM_NULLPTR;
          // str << "    \"" << ostr << "\" [ label=\"" << libName
          // <<  "\" shape=\"ellipse\"];" << std::endl;
        }
      }
    }
  }
  return cnt;
}